

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseBody(TidyDocImpl *doc,Node *body,GetTokenMode mode)

{
  Node **ppNVar1;
  uint uVar2;
  Lexer *pLVar3;
  Dict *pDVar4;
  Dict *pDVar5;
  bool bVar6;
  GetTokenMode GVar7;
  Bool BVar8;
  int iVar9;
  Node *node;
  Node **ppNVar10;
  GetTokenMode mode_00;
  TidyTagId TVar11;
  uint vers;
  Node *pNVar12;
  bool bVar13;
  
  pLVar3 = doc->lexer;
  prvTidyBumpObject(doc,body->parent);
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node != (Node *)0x0) {
    ppNVar1 = &body->content;
    bVar6 = true;
    mode_00 = IgnoreWhitespace;
    do {
      pDVar4 = node->tag;
      if ((pDVar4 == body->tag) && (node->type == StartTag)) goto LAB_001421df;
      if ((pDVar4 != (Dict *)0x0) && (pDVar4->id == TidyTag_HTML)) {
        BVar8 = prvTidynodeIsElement(node);
        if ((BVar8 != no) || (pLVar3->seenEndHtml != no)) goto LAB_001421df;
        pLVar3->seenEndHtml = yes;
        goto LAB_001421f4;
      }
      if ((pLVar3->seenEndBody != no) && (node->type - StartTag < 3)) {
        prvTidyReport(doc,body,node,0x233);
      }
      pDVar4 = node->tag;
      if ((pDVar4 == body->tag) && (node->type == EndTag)) {
        body->closed = yes;
        TrimSpaces(doc,body);
        prvTidyFreeNode(doc,node);
        pLVar3->seenEndBody = yes;
        mode_00 = IgnoreWhitespace;
        if ((body->parent != (Node *)0x0) &&
           ((pDVar4 = body->parent->tag, mode_00 = IgnoreWhitespace, pDVar4 != (Dict *)0x0 &&
            (pDVar4->id == TidyTag_NOFRAMES)))) {
          return;
        }
        goto LAB_00142357;
      }
      if (pDVar4 != (Dict *)0x0) {
        if (pDVar4->id == TidyTag_NOFRAMES) {
          if (node->type != EndTag) {
            if (node->type == StartTag) {
              node->parent = body;
              pNVar12 = body->last;
              node->prev = pNVar12;
              ppNVar10 = &pNVar12->next;
              if (pNVar12 == (Node *)0x0) {
                ppNVar10 = ppNVar1;
              }
              *ppNVar10 = node;
              body->last = node;
              prvTidyParseBlock(doc,node,mode_00);
              goto LAB_00142357;
            }
            goto LAB_001422f0;
          }
          if (((body->parent == (Node *)0x0) || (pDVar5 = body->parent->tag, pDVar5 == (Dict *)0x0))
             || (pDVar5->id != TidyTag_NOFRAMES)) goto LAB_001422f0;
        }
        else {
LAB_001422f0:
          if ((pDVar4 == (Dict *)0x0) ||
             ((((pDVar4->id != TidyTag_FRAME &&
                ((pDVar4 == (Dict *)0x0 || (pDVar4->id != TidyTag_FRAMESET)))) ||
               (body->parent == (Node *)0x0)) ||
              ((pDVar4 = body->parent->tag, pDVar4 == (Dict *)0x0 ||
               (pDVar4->id != TidyTag_NOFRAMES)))))) goto LAB_0014231e;
        }
        TrimSpaces(doc,body);
LAB_0014276e:
        prvTidyUngetToken(doc);
        return;
      }
LAB_0014231e:
      BVar8 = prvTidynodeIsText(node);
      if ((BVar8 == no) || (node->start + 1 < node->end)) {
        bVar13 = false;
      }
      else {
        bVar13 = pLVar3->lexbuf[node->start] == ' ';
      }
      BVar8 = InsertMisc(body,node);
      if (BVar8 == no) {
        BVar8 = prvTidynodeIsText(node);
        if (BVar8 == no) {
          if (node->type == DocTypeTag) {
            InsertDocType(doc,body,node);
          }
          else {
            if ((node->tag == (Dict *)0x0) || (TVar11 = node->tag->id, TVar11 == TidyTag_PARAM))
            goto LAB_001421df;
            pLVar3->excludeBlocks = no;
            if (((TVar11 == TidyTag_INPUT) ||
                ((BVar8 = prvTidynodeHasCM(node,8), BVar8 == no &&
                 (BVar8 = prvTidynodeHasCM(node,0x10), BVar8 == no)))) &&
               (BVar8 = prvTidyIsHTML5Mode(doc), BVar8 == no)) {
              if ((node->tag->model & 4) == 0) {
                prvTidyReport(doc,body,node,0x27e);
              }
              pDVar4 = node->tag;
              uVar2 = pDVar4->model;
              if ((uVar2 & 2) == 0) {
                if ((uVar2 & 4) != 0) {
                  MoveToHead(doc,body,node);
                  goto LAB_00142357;
                }
                if ((uVar2 & 0x20) == 0) {
                  if ((uVar2 & 0x40) == 0) {
                    if ((uVar2 & 0x380) == 0) {
                      if ((pDVar4 == (Dict *)0x0) || (pDVar4->id != TidyTag_INPUT)) {
                        BVar8 = prvTidynodeHasCM(node,0x600);
                        if (BVar8 == no) goto LAB_0014276e;
                        goto LAB_001421f4;
                      }
                      prvTidyUngetToken(doc);
                      TVar11 = TidyTag_FORM;
                    }
                    else {
                      if (node->type == EndTag) goto LAB_00142590;
                      prvTidyUngetToken(doc);
                      TVar11 = TidyTag_TABLE;
                    }
                  }
                  else {
                    prvTidyUngetToken(doc);
                    TVar11 = TidyTag_DL;
                  }
                  node = prvTidyInferredTag(doc,TVar11);
                }
                else {
                  prvTidyUngetToken(doc);
                  node = prvTidyInferredTag(doc,TidyTag_UL);
                  AddClassNoIndent(doc,node);
                }
LAB_00142590:
                pLVar3->excludeBlocks = yes;
                goto LAB_00142598;
              }
              if (((pDVar4 != (Dict *)0x0) && (pDVar4->id == TidyTag_BODY)) &&
                 ((body->implicit != no && (body->attributes == (AttVal *)0x0)))) {
                body->attributes = node->attributes;
                node->attributes = (AttVal *)0x0;
              }
            }
            else {
LAB_00142598:
              if (node->type == EndTag) {
                if ((node == (Node *)0x0) || (pDVar4 = node->tag, pDVar4 == (Dict *)0x0)) {
LAB_001425d8:
                  BVar8 = prvTidynodeHasCM(node,0x10);
                  if (BVar8 != no) {
                    prvTidyPopInline(doc,node);
                  }
                }
                else if (pDVar4->id == TidyTag_BR) {
                  node->type = StartTag;
                }
                else {
                  if ((pDVar4 == (Dict *)0x0) || (pDVar4->id != TidyTag_P)) goto LAB_001425d8;
                  node->type = StartEndTag;
                  node->implicit = yes;
                }
              }
              BVar8 = prvTidynodeIsElement(node);
              if (BVar8 != no) {
                if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
                   (node->tag->id == TidyTag_MAIN)) {
                  if (doc == (TidyDocImpl *)0x0) {
                    pNVar12 = (Node *)0x0;
                  }
                  else {
                    pNVar12 = (doc->root).content;
                  }
                  BVar8 = prvTidyFindNodeWithId(pNVar12,TidyTag_MAIN);
                  if (BVar8 != no) {
                    *(byte *)&doc->badForm = (byte)doc->badForm | 2;
                    goto LAB_001421df;
                  }
                }
                BVar8 = prvTidynodeHasCM(node,0x10);
                if (BVar8 == no) {
                  bVar6 = true;
                  GVar7 = IgnoreWhitespace;
                }
                else {
                  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                     (vers = 0xfffffedb, node->tag->id != TidyTag_IMG)) {
                    vers = 0xfffffeda;
                  }
                  prvTidyConstrainVersion(doc,vers);
                  if (bVar6) {
                    GVar7 = MixedContent;
                    if (node->implicit == no) {
                      iVar9 = prvTidyInlineDup(doc,node);
                      bVar6 = false;
                      if (0 < iVar9) goto LAB_00142357;
                    }
                    else {
                      bVar6 = true;
                    }
                  }
                  else {
                    bVar6 = false;
                    GVar7 = MixedContent;
                  }
                }
                mode_00 = GVar7;
                if (node->implicit != no) {
                  prvTidyReport(doc,body,node,0x247);
                }
                node->parent = body;
                pNVar12 = body->last;
                node->prev = pNVar12;
                ppNVar10 = &pNVar12->next;
                if (pNVar12 == (Node *)0x0) {
                  ppNVar10 = ppNVar1;
                }
                *ppNVar10 = node;
                body->last = node;
                ParseTag(doc,node,mode_00);
                goto LAB_00142357;
              }
LAB_001421df:
              prvTidyReport(doc,body,node,0x235);
            }
LAB_001421f4:
            prvTidyFreeNode(doc,node);
          }
        }
        else if ((bool)(bVar13 ^ 1) || mode_00 != IgnoreWhitespace) {
          prvTidyConstrainVersion(doc,0xfffffeda);
          if (bVar6) {
            iVar9 = prvTidyInlineDup(doc,node);
            bVar6 = false;
            if (0 < iVar9) goto LAB_00142357;
          }
          node->parent = body;
          pNVar12 = body->last;
          node->prev = pNVar12;
          ppNVar10 = &pNVar12->next;
          if (pNVar12 == (Node *)0x0) {
            ppNVar10 = ppNVar1;
          }
          *ppNVar10 = node;
          body->last = node;
          bVar6 = false;
          mode_00 = MixedContent;
        }
        else {
          prvTidyFreeNode(doc,node);
          mode_00 = IgnoreWhitespace;
        }
      }
LAB_00142357:
      node = prvTidyGetToken(doc,mode_00);
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(ParseBody)(TidyDocImpl* doc, Node *body, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool checkstack, iswhitenode;

    mode = IgnoreWhitespace;
    checkstack = yes;

    TY_(BumpObject)( doc, body->parent );

    DEBUG_LOG(SPRTF("Enter ParseBody...\n"));
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /* find and discard multiple <body> elements */
        if (node->tag == body->tag && node->type == StartTag)
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* #538536 Extra endtags not detected */
        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node) || lexer->seenEndHtml) 
                TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            else
                lexer->seenEndHtml = 1;

            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( lexer->seenEndBody && 
             ( node->type == StartTag ||
               node->type == EndTag   ||
               node->type == StartEndTag ) )
        {
            TY_(Report)(doc, body, node, CONTENT_AFTER_BODY );
        }

        if ( node->tag == body->tag && node->type == EndTag )
        {
            body->closed = yes;
            TrimSpaces(doc, body);
            TY_(FreeNode)( doc, node);
            lexer->seenEndBody = 1;
            mode = IgnoreWhitespace;

            if ( nodeIsNOFRAMES(body->parent) )
                break;

            continue;
        }

        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type == StartTag)
            {
                TY_(InsertNodeAtEnd)(body, node);
                TY_(ParseBlock)(doc, node, mode);
                continue;
            }

            if (node->type == EndTag && nodeIsNOFRAMES(body->parent) )
            {
                TrimSpaces(doc, body);
                TY_(UngetToken)( doc );
                break;
            }
        }

        if ( (nodeIsFRAME(node) || nodeIsFRAMESET(node))
             && nodeIsNOFRAMES(body->parent) )
        {
            TrimSpaces(doc, body);
            TY_(UngetToken)( doc );
            break;
        }
        
        iswhitenode = no;

        if ( TY_(nodeIsText)(node) &&
             node->end <= node->start + 1 &&
             lexer->lexbuf[node->start] == ' ' )
            iswhitenode = yes;

        /* deal with comments etc. */
        if (InsertMisc(body, node))
            continue;

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if (iswhitenode && mode == IgnoreWhitespace)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* HTML 2 and HTML4 strict don't allow text here */
            TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT | VERS_HTML20));

            if (checkstack)
            {
                checkstack = no;

                if ( TY_(InlineDup)(doc, node) > 0 )
                    continue;
            }

            TY_(InsertNodeAtEnd)(body, node);
            mode = MixedContent;
            continue;
        }

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, body, node);
            continue;
        }
        /* discard unknown  and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          Netscape allows LI and DD directly in BODY
          We infer UL or DL respectively and use this
          Bool to exclude block-level elements so as
          to match Netscape's observed behaviour.
        */
        lexer->excludeBlocks = no;
        
        if (( nodeIsINPUT(node) ||
             (!TY_(nodeHasCM)(node, CM_BLOCK) && !TY_(nodeHasCM)(node, CM_INLINE))
           ) && !TY_(IsHTML5Mode)(doc) )
        {
            /* avoid this error message being issued twice */
            if (!(node->tag->model & CM_HEAD))
                TY_(Report)(doc, body, node, TAG_NOT_ALLOWED_IN);

            if (node->tag->model & CM_HTML)
            {
                /* copy body attributes if current body was inferred */
                if ( nodeIsBODY(node) && body->implicit 
                     && body->attributes == NULL )
                {
                    body->attributes = node->attributes;
                    node->attributes = NULL;
                }

                TY_(FreeNode)( doc, node);
                continue;
            }

            if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, body, node);
                continue;
            }

            if (node->tag->model & CM_LIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_UL);
                AddClassNoIndent(doc, node);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & CM_DEFLIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_DL);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & (CM_TABLE | CM_ROWGRP | CM_ROW))
            {
                /* http://tidy.sf.net/issue/2855621 */
                if (node->type != EndTag) {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                lexer->excludeBlocks = yes;
            }
            else if ( nodeIsINPUT(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_FORM);
                lexer->excludeBlocks = yes;
            }
            else
            {
                if ( !TY_(nodeHasCM)(node, CM_ROW | CM_FIELD) )
                {
                    TY_(UngetToken)( doc );
                    return;
                }

                /* ignore </td> </th> <option> etc. */
                TY_(FreeNode)( doc, node );
                continue;
            }
        }

        if (node->type == EndTag)
        {
            if ( nodeIsBR(node) )
                node->type = StartTag;
            else if ( nodeIsP(node) )
            {
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if ( TY_(nodeHasCM)(node, CM_INLINE) )
                TY_(PopInline)( doc, node );
        }

        if (TY_(nodeIsElement)(node))
        {
            if (nodeIsMAIN(node)) {
                /*\ Issue #166 - repeated <main> element
                 *  How to efficiently search for a previous main element?
                \*/
                if ( TY_(FindNodeById)(doc, TidyTag_MAIN) )
                {
                    doc->badForm |= flg_BadMain; /* this is an ERROR in format */
                    TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
            }
            /* Issue #20 - merging from Ger Hobbelt fork put back CM_MIXED, which had been
               removed to fix this issue - reverting to fix 880221e
             */
            if ( TY_(nodeHasCM)(node, CM_INLINE) )
            {
                /* HTML4 strict doesn't allow inline content here */
                /* but HTML2 does allow img elements as children of body */
                if ( nodeIsIMG(node) )
                    TY_(ConstrainVersion)(doc, ~VERS_HTML40_STRICT);
                else
                    TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT|VERS_HTML20));

                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }

                mode = MixedContent;
            }
            else
            {
                checkstack = yes;
                mode = IgnoreWhitespace;
            }

            if (node->implicit)
                TY_(Report)(doc, body, node, INSERTING_TAG);

            TY_(InsertNodeAtEnd)(body, node);
            ParseTag(doc, node, mode);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG(SPRTF("Exit ParseBody 1...\n"));
}